

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O1

void xmlThrDefSetGenericErrorFunc(void *ctx,xmlGenericErrorFunc handler)

{
  code *pcVar1;
  
  xmlMutexLock(&xmlThrDefMutex);
  pcVar1 = xmlGenericErrorDefaultFunc;
  if (handler != (xmlGenericErrorFunc)0x0) {
    pcVar1 = handler;
  }
  xmlGenericErrorThrDef = pcVar1;
  xmlGenericErrorContextThrDef = ctx;
  xmlMutexUnlock(&xmlThrDefMutex);
  return;
}

Assistant:

void
xmlThrDefSetGenericErrorFunc(void *ctx, xmlGenericErrorFunc handler) {
    xmlMutexLock(&xmlThrDefMutex);
    xmlGenericErrorContextThrDef = ctx;
    if (handler != NULL)
	xmlGenericErrorThrDef = handler;
    else
	xmlGenericErrorThrDef = xmlGenericErrorDefaultFunc;
    xmlMutexUnlock(&xmlThrDefMutex);
}